

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_tvp.c
# Opt level: O3

int jas_tvparser_next(jas_tvparser_t *tvp)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar6 = tvp->pos;
  cVar5 = *pcVar6;
  if (cVar5 != '\0') {
    ppuVar4 = __ctype_b_loc();
    pcVar3 = pcVar6;
    do {
      pcVar6 = pcVar3 + 1;
      uVar1 = (*ppuVar4)[cVar5];
      if ((uVar1 >> 0xd & 1) == 0) {
        if ((cVar5 != '_') && ((uVar1 & 0xc00) == 0)) {
          return -1;
        }
        goto LAB_0011454a;
      }
      cVar5 = *pcVar6;
      pcVar3 = pcVar6;
    } while (cVar5 != '\0');
  }
  tvp->pos = pcVar6;
  return 1;
LAB_0011454a:
  pcVar7 = pcVar6;
  if ((cVar5 != '_') && (uVar1 = (*ppuVar4)[cVar5], (uVar1 & 0xc00) == 0)) {
    if (cVar5 != '=') {
      if ((uVar1 >> 0xd & 1) == 0) {
        return -1;
      }
      pcVar7[-1] = '\0';
      tvp->tag = pcVar3;
      tvp->val = "";
      goto LAB_001145da;
    }
    pcVar7[-1] = '\0';
    cVar5 = *pcVar7;
    pcVar6 = pcVar7;
    if (cVar5 == '\0') goto LAB_001145e4;
    pcVar2 = pcVar7;
    goto LAB_001145a0;
  }
  cVar5 = *pcVar7;
  pcVar6 = pcVar7 + 1;
  if (cVar5 == '\0') {
    tvp->tag = pcVar3;
    tvp->val = "";
LAB_001145da:
    tvp->pos = pcVar7;
    return 0;
  }
  goto LAB_0011454a;
  while (cVar5 = *pcVar6, pcVar2 = pcVar6, cVar5 != '\0') {
LAB_001145a0:
    pcVar6 = pcVar2 + 1;
    if ((*(byte *)((long)*ppuVar4 + (long)cVar5 * 2 + 1) & 0x20) != 0) {
      *pcVar2 = '\0';
      break;
    }
  }
LAB_001145e4:
  tvp->pos = pcVar6;
  tvp->tag = pcVar3;
  tvp->val = pcVar7;
  return 0;
}

Assistant:

int jas_tvparser_next(jas_tvparser_t *tvp)
{
	char *p;
	char *tag;
	char *val;

	/* Skip any leading whitespace. */
	p = tvp->pos;
	while (*p != '\0' && isspace(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* No more tags are present. */
		tvp->pos = p;
		return 1;
	}

	/* Does the tag name begin with a valid character? */
	if (!JAS_TVP_ISTAG(*p)) {
		return -1;
	}

	/* Remember where the tag name begins. */
	tag = p;

	/* Find the end of the tag name. */
	while (*p != '\0' && JAS_TVP_ISTAG(*p)) {
		++p;
	}

	/* Has the end of the input data been reached? */
	if (*p == '\0') {
		/* The value field is empty. */
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	/* Is a value field not present? */
	if (*p != '=') {
		if (*p != '\0' && !isspace(*p)) {
			return -1;
		}
		*p++ = '\0';
		tvp->tag = tag;
		tvp->val = "";
		tvp->pos = p;
		return 0;
	}

	*p++ = '\0';

	val = p;
	while (*p != '\0' && !isspace(*p)) {
		++p;
	}

	if (*p != '\0') {
		*p++ = '\0';
	}

	tvp->pos = p;
	tvp->tag = tag;
	tvp->val = val;

	return 0;
}